

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_queue.h
# Opt level: O0

bool __thiscall
webrtc::
SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>::
Insert(SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
       *this,vector<short,_std::allocator<short>_> *input)

{
  size_type sVar1;
  vector<short,_std::allocator<short>_> *__x;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference __y;
  FatalMessage local_658;
  size_type local_4e0;
  string *local_4d8;
  string *_result_1;
  size_type local_358;
  string *local_350;
  string *_result;
  FatalMessage local_340;
  FatalMessageVoidify local_1c1;
  CritScope local_1c0;
  CritScope cs;
  FatalMessage local_1a0;
  FatalMessageVoidify local_21;
  vector<short,_std::allocator<short>_> *local_20;
  vector<short,_std::allocator<short>_> *input_local;
  SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
  *this_local;
  
  local_20 = input;
  input_local = (vector<short,_std::allocator<short>_> *)this;
  if (input == (vector<short,_std::allocator<short>_> *)0x0) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_21);
    rtc::FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
               ,0x79);
    poVar3 = rtc::FatalMessage::stream(&local_1a0);
    poVar3 = std::operator<<(poVar3,"Check failed: input");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# ");
    rtc::FatalMessageVoidify::operator&(&local_21,poVar3);
    rtc::FatalMessage::~FatalMessage(&local_1a0);
  }
  rtc::CritScope::CritScope(&local_1c0,&this->crit_queue_);
  _result._7_1_ = 0;
  bVar2 = RenderQueueItemVerifier<short>::operator()(&this->queue_item_verifier_,local_20);
  if (!bVar2) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_1c1);
    rtc::FatalMessage::FatalMessage
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
               ,0x7d);
    _result._7_1_ = 1;
    poVar3 = rtc::FatalMessage::stream(&local_340);
    poVar3 = std::operator<<(poVar3,"Check failed: queue_item_verifier_(*input)");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# ");
    rtc::FatalMessageVoidify::operator&(&local_1c1,poVar3);
  }
  if ((_result._7_1_ & 1) == 0) {
    sVar1 = this->num_elements_;
    sVar4 = std::
            vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
            ::size(&this->queue_);
    __x = local_20;
    if (sVar1 == sVar4) {
      this_local._7_1_ = 0;
    }
    else {
      __y = std::
            vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
            ::operator[](&this->queue_,this->next_write_index_);
      std::swap<short,std::allocator<short>>(__x,__y);
      this->next_write_index_ = this->next_write_index_ + 1;
      sVar1 = this->next_write_index_;
      sVar4 = std::
              vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
              ::size(&this->queue_);
      if (sVar1 == sVar4) {
        this->next_write_index_ = 0;
      }
      this->num_elements_ = this->num_elements_ + 1;
      local_358 = std::
                  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                  ::size(&this->queue_);
      local_350 = rtc::CheckLTImpl<unsigned_long,unsigned_long>
                            (&this->next_write_index_,&local_358,"next_write_index_ < queue_.size()"
                            );
      if (local_350 != (string *)0x0) {
        rtc::FatalMessage::FatalMessage
                  ((FatalMessage *)&_result_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                   ,0x8d,local_350);
        rtc::FatalMessage::stream((FatalMessage *)&_result_1);
        rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
      }
      local_4e0 = std::
                  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                  ::size(&this->queue_);
      local_4d8 = rtc::CheckLEImpl<unsigned_long,unsigned_long>
                            (&this->num_elements_,&local_4e0,"num_elements_ <= queue_.size()");
      if (local_4d8 != (string *)0x0) {
        rtc::FatalMessage::FatalMessage
                  (&local_658,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                   ,0x8e,local_4d8);
        rtc::FatalMessage::stream(&local_658);
        rtc::FatalMessage::~FatalMessage(&local_658);
      }
      this_local._7_1_ = 1;
      local_4d8 = (string *)0x0;
    }
    _result._0_4_ = 1;
    rtc::CritScope::~CritScope(&local_1c0);
    return (bool)(this_local._7_1_ & 1);
  }
  rtc::FatalMessage::~FatalMessage(&local_340);
}

Assistant:

bool Insert(T* input) WARN_UNUSED_RESULT {
    RTC_DCHECK(input);

    rtc::CritScope cs(&crit_queue_);

    RTC_DCHECK(queue_item_verifier_(*input));

    if (num_elements_ == queue_.size()) {
      return false;
    }

    using std::swap;
    swap(*input, queue_[next_write_index_]);

    ++next_write_index_;
    if (next_write_index_ == queue_.size()) {
      next_write_index_ = 0;
    }

    ++num_elements_;

    RTC_DCHECK_LT(next_write_index_, queue_.size());
    RTC_DCHECK_LE(num_elements_, queue_.size());

    return true;
  }